

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  int *__s;
  int *piVar15;
  unsigned_short *__ptr;
  int *__s_00;
  uchar *puVar16;
  uint *puVar17;
  undefined1 (*frequencies) [16];
  undefined1 (*frequencies_00) [16];
  uint *puVar18;
  void *__dest;
  void *__ptr_00;
  ulong uVar19;
  unsigned_short uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint *puVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  size_t sVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  uint uVar36;
  long lVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar85;
  int iVar86;
  undefined1 auVar84 [16];
  int iVar87;
  long local_210;
  LodePNGBitWriter local_190;
  ucvector v;
  HuffmanTree tree_ll;
  undefined1 local_108 [16];
  size_t local_f8;
  unsigned_short *local_e8;
  int *local_e0;
  int *local_d8;
  unsigned_short *local_d0;
  HuffmanTree tree_d;
  undefined1 local_98 [40];
  ulong local_70;
  ulong local_68;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_190.data = &v;
  local_190.bp = '\0';
  uVar36 = settings->btype;
  uVar13 = 0x3d;
  if (uVar36 < 3) {
    sVar29 = insize;
    v.allocsize = v.size;
    if (uVar36 != 1) {
      if (uVar36 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar13 = 0;
        }
        else {
          uVar34 = (insize + 0xfffe) / 0xffff;
          uVar36 = 0;
          do {
            sVar29 = v.size;
            uVar13 = (int)insize - uVar36;
            if (0xfffe < insize - uVar36) {
              uVar13 = 0xffff;
            }
            uVar23 = (ulong)uVar13;
            uVar33 = uVar23 + v.size + 5;
            puVar16 = v.data;
            if (v.allocsize < uVar33) {
              sVar31 = (v.allocsize >> 1) + uVar33;
              puVar16 = (uchar *)realloc(v.data,sVar31);
              v.allocsize = sVar31;
              if (puVar16 == (uchar *)0x0) {
                uVar13 = 0x53;
                goto LAB_0010970b;
              }
            }
            v.data = puVar16;
            v.data[sVar29] = uVar34 == 1;
            v.data[sVar29 + 1] = (uchar)uVar13;
            v.data[sVar29 + 2] = (uchar)(uVar13 >> 8);
            v.data[sVar29 + 3] = (uchar)(0xffff - uVar13);
            v.data[sVar29 + 4] = (uchar)(0xffff - uVar13 >> 8);
            v.size = uVar33;
            if (uVar23 != 0) {
              memcpy(v.data + sVar29 + 5,in + uVar36,uVar23);
            }
            uVar36 = uVar36 + uVar13;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
          uVar13 = 0;
        }
        goto LAB_0010970b;
      }
      uVar34 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar34 = insize >> 3;
      }
      if (0x3fff7 < uVar34) {
        uVar34 = 0x3fff8;
      }
      sVar29 = uVar34 + 8;
    }
    uVar34 = 1;
    if (!CARRY8(insize - 1,sVar29)) {
      uVar34 = ((insize - 1) + sVar29) / sVar29;
    }
    uVar23 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    piVar15 = (int *)malloc(uVar23 * 4);
    sVar31 = uVar23 * 2;
    hash.val = piVar15;
    __ptr = (unsigned_short *)malloc(sVar31);
    hash.chain = __ptr;
    local_d0 = (unsigned_short *)malloc(sVar31);
    hash.zeros = local_d0;
    __s_00 = (int *)malloc(0x40c);
    hash.headz = __s_00;
    local_e8 = (unsigned_short *)malloc(sVar31);
    uVar13 = 0x53;
    local_e0 = piVar15;
    local_d8 = __s;
    hash.chainz = local_e8;
    if (((((piVar15 != (int *)0x0) && (__s != (int *)0x0)) && (__ptr != (unsigned_short *)0x0)) &&
        ((local_d0 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_e8 != (unsigned_short *)0x0)) {
      memset(__s,0xff,0x40000);
      if (uVar23 == 0) {
        memset(__s_00,0xff,0x40c);
      }
      else {
        memset(local_e0,0xff,uVar23 * 4);
        auVar9 = _DAT_00117130;
        lVar37 = uVar23 - 1;
        auVar84._8_4_ = (int)lVar37;
        auVar84._0_8_ = lVar37;
        auVar84._12_4_ = (int)((ulong)lVar37 >> 0x20);
        uVar33 = 0;
        auVar84 = auVar84 ^ _DAT_00117130;
        auVar52 = _DAT_00117150;
        auVar78 = _DAT_00117160;
        auVar82 = _DAT_00117120;
        auVar56 = _DAT_001170f0;
        do {
          auVar43 = auVar56 ^ auVar9;
          iVar83 = auVar84._0_4_;
          iVar70 = -(uint)(iVar83 < auVar43._0_4_);
          iVar85 = auVar84._4_4_;
          auVar44._4_4_ = -(uint)(iVar85 < auVar43._4_4_);
          iVar86 = auVar84._8_4_;
          iVar75 = -(uint)(iVar86 < auVar43._8_4_);
          iVar87 = auVar84._12_4_;
          auVar44._12_4_ = -(uint)(iVar87 < auVar43._12_4_);
          auVar63._4_4_ = iVar70;
          auVar63._0_4_ = iVar70;
          auVar63._8_4_ = iVar75;
          auVar63._12_4_ = iVar75;
          auVar76 = pshuflw(in_XMM8,auVar63,0xe8);
          auVar46._4_4_ = -(uint)(auVar43._4_4_ == iVar85);
          auVar46._12_4_ = -(uint)(auVar43._12_4_ == iVar87);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar81 = pshuflw(in_XMM9,auVar46,0xe8);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar77 = pshuflw(auVar76,auVar44,0xe8);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar77 | auVar81 & auVar76) ^ auVar43;
          auVar43 = packssdw(auVar43,auVar43);
          uVar20 = (unsigned_short)uVar33;
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr[uVar33] = uVar20;
          }
          auVar44 = auVar46 & auVar63 | auVar44;
          auVar43 = packssdw(auVar44,auVar44);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar77,auVar43 ^ auVar77);
          if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
            __ptr[uVar33 + 1] = uVar20 + 1;
          }
          auVar43 = auVar82 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar43._0_4_);
          auVar71._4_4_ = -(uint)(iVar85 < auVar43._4_4_);
          iVar75 = -(uint)(iVar86 < auVar43._8_4_);
          auVar71._12_4_ = -(uint)(iVar87 < auVar43._12_4_);
          auVar45._4_4_ = iVar70;
          auVar45._0_4_ = iVar70;
          auVar45._8_4_ = iVar75;
          auVar45._12_4_ = iVar75;
          auVar62._4_4_ = -(uint)(auVar43._4_4_ == iVar85);
          auVar62._12_4_ = -(uint)(auVar43._12_4_ == iVar87);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar43 = auVar62 & auVar45 | auVar71;
          auVar43 = packssdw(auVar43,auVar43);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar2,auVar43 ^ auVar2);
          if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 2] = uVar20 + 2;
          }
          auVar46 = pshufhw(auVar45,auVar45,0x84);
          auVar63 = pshufhw(auVar62,auVar62,0x84);
          auVar44 = pshufhw(auVar46,auVar71,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar44 | auVar63 & auVar46) ^ auVar47;
          auVar46 = packssdw(auVar47,auVar47);
          if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 3] = uVar20 + 3;
          }
          auVar46 = auVar78 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar46._0_4_);
          auVar49._4_4_ = -(uint)(iVar85 < auVar46._4_4_);
          iVar75 = -(uint)(iVar86 < auVar46._8_4_);
          auVar49._12_4_ = -(uint)(iVar87 < auVar46._12_4_);
          auVar64._4_4_ = iVar70;
          auVar64._0_4_ = iVar70;
          auVar64._8_4_ = iVar75;
          auVar64._12_4_ = iVar75;
          auVar43 = pshuflw(auVar43,auVar64,0xe8);
          auVar48._4_4_ = -(uint)(auVar46._4_4_ == iVar85);
          auVar48._12_4_ = -(uint)(auVar46._12_4_ == iVar87);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          in_XMM9 = pshuflw(auVar81 & auVar76,auVar48,0xe8);
          in_XMM9 = in_XMM9 & auVar43;
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar43 = pshuflw(auVar43,auVar49,0xe8);
          auVar76._8_4_ = 0xffffffff;
          auVar76._0_8_ = 0xffffffffffffffff;
          auVar76._12_4_ = 0xffffffff;
          auVar76 = (auVar43 | in_XMM9) ^ auVar76;
          auVar43 = packssdw(auVar76,auVar76);
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 4] = uVar20 + 4;
          }
          auVar49 = auVar48 & auVar64 | auVar49;
          auVar43 = packssdw(auVar49,auVar49);
          auVar81._8_4_ = 0xffffffff;
          auVar81._0_8_ = 0xffffffffffffffff;
          auVar81._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar81,auVar43 ^ auVar81);
          if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 5] = uVar20 + 5;
          }
          auVar43 = auVar52 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar43._0_4_);
          auVar72._4_4_ = -(uint)(iVar85 < auVar43._4_4_);
          iVar75 = -(uint)(iVar86 < auVar43._8_4_);
          auVar72._12_4_ = -(uint)(iVar87 < auVar43._12_4_);
          auVar50._4_4_ = iVar70;
          auVar50._0_4_ = iVar70;
          auVar50._8_4_ = iVar75;
          auVar50._12_4_ = iVar75;
          auVar65._4_4_ = -(uint)(auVar43._4_4_ == iVar85);
          auVar65._12_4_ = -(uint)(auVar43._12_4_ == iVar87);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar43 = auVar65 & auVar50 | auVar72;
          auVar43 = packssdw(auVar43,auVar43);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar43 ^ auVar3,auVar43 ^ auVar3);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 6] = uVar20 + 6;
          }
          auVar43 = pshufhw(auVar50,auVar50,0x84);
          auVar44 = pshufhw(auVar65,auVar65,0x84);
          auVar46 = pshufhw(auVar43,auVar72,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar46 | auVar44 & auVar43) ^ auVar51;
          auVar43 = packssdw(auVar51,auVar51);
          if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr[uVar33 + 7] = uVar20 + 7;
          }
          uVar33 = uVar33 + 8;
          lVar37 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + 8;
          auVar56._8_8_ = lVar37 + 8;
          lVar37 = auVar82._8_8_;
          auVar82._0_8_ = auVar82._0_8_ + 8;
          auVar82._8_8_ = lVar37 + 8;
          lVar37 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 8;
          auVar78._8_8_ = lVar37 + 8;
          lVar37 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 8;
          auVar52._8_8_ = lVar37 + 8;
        } while ((uVar23 + 7 & 0xfffffffffffffff8) != uVar33);
        memset(__s_00,0xff,0x40c);
        auVar9 = _DAT_00117130;
        uVar33 = 0;
        auVar39 = _DAT_00117150;
        auVar40 = _DAT_00117160;
        auVar41 = _DAT_00117120;
        auVar42 = _DAT_001170f0;
        do {
          auVar52 = auVar42 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar52._0_4_);
          auVar54._4_4_ = -(uint)(iVar85 < auVar52._4_4_);
          iVar75 = -(uint)(iVar86 < auVar52._8_4_);
          auVar54._12_4_ = -(uint)(iVar87 < auVar52._12_4_);
          auVar66._4_4_ = iVar70;
          auVar66._0_4_ = iVar70;
          auVar66._8_4_ = iVar75;
          auVar66._12_4_ = iVar75;
          auVar78 = pshuflw(in_XMM8,auVar66,0xe8);
          auVar53._4_4_ = -(uint)(auVar52._4_4_ == iVar85);
          auVar53._12_4_ = -(uint)(auVar52._12_4_ == iVar87);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar82 = pshuflw(in_XMM9,auVar53,0xe8);
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar52 = pshuflw(auVar78,auVar54,0xe8);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          auVar79 = (auVar52 | auVar82 & auVar78) ^ auVar79;
          auVar52 = packssdw(auVar79,auVar79);
          uVar20 = (unsigned_short)uVar33;
          if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar33] = uVar20;
          }
          auVar54 = auVar53 & auVar66 | auVar54;
          auVar52 = packssdw(auVar54,auVar54);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar4,auVar52 ^ auVar4);
          if ((auVar52._0_4_ >> 0x10 & 1) != 0) {
            local_e8[uVar33 + 1] = uVar20 + 1;
          }
          auVar52 = auVar41 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar52._0_4_);
          auVar73._4_4_ = -(uint)(iVar85 < auVar52._4_4_);
          iVar75 = -(uint)(iVar86 < auVar52._8_4_);
          auVar73._12_4_ = -(uint)(iVar87 < auVar52._12_4_);
          auVar55._4_4_ = iVar70;
          auVar55._0_4_ = iVar70;
          auVar55._8_4_ = iVar75;
          auVar55._12_4_ = iVar75;
          auVar67._4_4_ = -(uint)(auVar52._4_4_ == iVar85);
          auVar67._12_4_ = -(uint)(auVar52._12_4_ == iVar87);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar52 = auVar67 & auVar55 | auVar73;
          auVar52 = packssdw(auVar52,auVar52);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar5,auVar52 ^ auVar5);
          if ((auVar52 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 2] = uVar20 + 2;
          }
          auVar56 = pshufhw(auVar55,auVar55,0x84);
          auVar43 = pshufhw(auVar67,auVar67,0x84);
          auVar84 = pshufhw(auVar56,auVar73,0x84);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar84 | auVar43 & auVar56) ^ auVar57;
          auVar56 = packssdw(auVar57,auVar57);
          if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 3] = uVar20 + 3;
          }
          auVar56 = auVar40 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar56._0_4_);
          auVar59._4_4_ = -(uint)(iVar85 < auVar56._4_4_);
          iVar75 = -(uint)(iVar86 < auVar56._8_4_);
          auVar59._12_4_ = -(uint)(iVar87 < auVar56._12_4_);
          auVar68._4_4_ = iVar70;
          auVar68._0_4_ = iVar70;
          auVar68._8_4_ = iVar75;
          auVar68._12_4_ = iVar75;
          auVar52 = pshuflw(auVar52,auVar68,0xe8);
          auVar58._4_4_ = -(uint)(auVar56._4_4_ == iVar85);
          auVar58._12_4_ = -(uint)(auVar56._12_4_ == iVar87);
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          in_XMM9 = pshuflw(auVar82 & auVar78,auVar58,0xe8);
          in_XMM9 = in_XMM9 & auVar52;
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar52 = pshuflw(auVar52,auVar59,0xe8);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar80 = (auVar52 | in_XMM9) ^ auVar80;
          auVar52 = packssdw(auVar80,auVar80);
          if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 4] = uVar20 + 4;
          }
          auVar59 = auVar58 & auVar68 | auVar59;
          auVar52 = packssdw(auVar59,auVar59);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar6,auVar52 ^ auVar6);
          if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 5] = uVar20 + 5;
          }
          auVar52 = auVar39 ^ auVar9;
          iVar70 = -(uint)(iVar83 < auVar52._0_4_);
          auVar74._4_4_ = -(uint)(iVar85 < auVar52._4_4_);
          iVar75 = -(uint)(iVar86 < auVar52._8_4_);
          auVar74._12_4_ = -(uint)(iVar87 < auVar52._12_4_);
          auVar60._4_4_ = iVar70;
          auVar60._0_4_ = iVar70;
          auVar60._8_4_ = iVar75;
          auVar60._12_4_ = iVar75;
          auVar69._4_4_ = -(uint)(auVar52._4_4_ == iVar85);
          auVar69._12_4_ = -(uint)(auVar52._12_4_ == iVar87);
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar52 = auVar69 & auVar60 | auVar74;
          auVar52 = packssdw(auVar52,auVar52);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar52 ^ auVar7,auVar52 ^ auVar7);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 6] = uVar20 + 6;
          }
          auVar52 = pshufhw(auVar60,auVar60,0x84);
          auVar82 = pshufhw(auVar69,auVar69,0x84);
          auVar78 = pshufhw(auVar52,auVar74,0x84);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar78 | auVar82 & auVar52) ^ auVar61;
          auVar52 = packssdw(auVar61,auVar61);
          if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar33 + 7] = uVar20 + 7;
          }
          uVar33 = uVar33 + 8;
          lVar37 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 8;
          auVar42._8_8_ = lVar37 + 8;
          lVar37 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar37 + 8;
          lVar37 = auVar40._8_8_;
          auVar40._0_8_ = auVar40._0_8_ + 8;
          auVar40._8_8_ = lVar37 + 8;
          lVar37 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 8;
          auVar39._8_8_ = lVar37 + 8;
        } while ((uVar23 + 7 & 0x1fffffff8) != uVar33);
      }
      if (uVar34 == 0) {
        uVar13 = 0;
      }
      else {
        local_68 = uVar34 - 1;
        lVar37 = 0;
        uVar33 = 0;
        puVar16 = in;
        uVar23 = sVar29;
        do {
          uVar26 = uVar23;
          if (insize < uVar23) {
            uVar26 = insize;
          }
          bVar38 = uVar33 == local_68;
          uVar32 = uVar33 * sVar29;
          uVar19 = uVar32 + sVar29;
          if (insize <= uVar32 + sVar29) {
            uVar19 = insize;
          }
          if (settings->btype == 2) {
            local_108 = (undefined1  [16])0x0;
            local_f8 = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_98._0_16_ = (undefined1  [16])0x0;
            local_98._24_16_ = (undefined1  [16])0x0;
            local_70 = uVar33;
            puVar17 = (uint *)malloc(0x478);
            frequencies = (undefined1 (*) [16])malloc(0x78);
            frequencies_00 = (undefined1 (*) [16])malloc(0x4c);
            if (frequencies_00 == (undefined1 (*) [16])0x0 ||
                (frequencies == (undefined1 (*) [16])0x0 || puVar17 == (uint *)0x0)) {
              uVar13 = 0x53;
              __dest = (void *)0x0;
              __ptr_00 = (void *)0x0;
            }
            else {
              uVar13 = 0x53;
              memset(puVar17,0,0x478);
              *frequencies = (undefined1  [16])0x0;
              frequencies[1] = (undefined1  [16])0x0;
              frequencies[2] = (undefined1  [16])0x0;
              frequencies[3] = (undefined1  [16])0x0;
              frequencies[4] = (undefined1  [16])0x0;
              frequencies[5] = (undefined1  [16])0x0;
              frequencies[6] = (undefined1  [16])0x0;
              *(undefined8 *)frequencies[7] = 0;
              *(undefined1 (*) [16])(frequencies_00[3] + 0xc) = (undefined1  [16])0x0;
              frequencies_00[3] = (undefined1  [16])0x0;
              frequencies_00[2] = (undefined1  [16])0x0;
              frequencies_00[1] = (undefined1  [16])0x0;
              *frequencies_00 = (undefined1  [16])0x0;
              if (settings->use_lz77 == 0) {
                sVar35 = uVar19 - uVar32;
                sVar31 = sVar35 * 4;
                if (sVar31 == 0) {
                  puVar18 = (uint *)0x0;
                  sVar31 = local_f8;
                  puVar25 = (uint *)local_108._0_8_;
                }
                else {
                  puVar18 = (uint *)malloc(sVar31);
                  puVar25 = puVar18;
                  uVar36 = uVar13;
                  if (puVar18 == (uint *)0x0) goto LAB_00108eb9;
                }
                local_108._0_8_ = puVar25;
                local_f8 = sVar31;
                local_108._8_8_ = sVar35;
                if (uVar32 < uVar19) {
                  lVar24 = 0;
                  do {
                    puVar18[lVar24] = (uint)puVar16[lVar24];
                    lVar24 = lVar24 + 1;
                  } while (uVar26 + lVar37 != lVar24);
                }
              }
              else {
                uVar36 = encodeLZ77((uivector *)local_108,&hash,in,uVar32,uVar19,
                                    settings->windowsize,settings->minmatch,settings->nicematch,
                                    settings->lazymatching);
                if (uVar36 != 0) {
LAB_00108eb9:
                  __ptr_00 = (void *)0x0;
                  __dest = (void *)0x0;
                  uVar13 = uVar36;
                  goto LAB_001095fe;
                }
                sVar35 = local_108._8_8_;
              }
              if (sVar35 != 0) {
                sVar21 = 0;
                do {
                  uVar36 = *(uint *)(local_108._0_8_ + sVar21 * 4);
                  puVar17[uVar36] = puVar17[uVar36] + 1;
                  if (0x100 < (ulong)uVar36) {
                    *(int *)(*frequencies + (ulong)*(uint *)(local_108._0_8_ + (sVar21 + 2) * 4) * 4
                            ) = *(int *)(*frequencies +
                                        (ulong)*(uint *)(local_108._0_8_ + (sVar21 + 2) * 4) * 4) +
                                1;
                    sVar21 = sVar21 + 3;
                  }
                  sVar21 = sVar21 + 1;
                } while (sVar21 != sVar35);
              }
              puVar17[0x100] = 1;
              uVar36 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar17,0x101,0x11e,0xf);
              if (uVar36 == 0) {
                uVar14 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)frequencies,2,0x1e,0xf);
                uVar10 = tree_d.numcodes;
                uVar36 = tree_ll.numcodes;
                if (uVar14 == 0) {
                  uVar33 = 0x11e;
                  if (tree_ll.numcodes < 0x11e) {
                    uVar33 = (ulong)tree_ll.numcodes;
                  }
                  uVar26 = 0x1e;
                  if (tree_d.numcodes < 0x1e) {
                    uVar26 = (ulong)tree_d.numcodes;
                  }
                  uVar19 = uVar33 + uVar26;
                  uVar32 = (ulong)(uint)((int)uVar19 * 4);
                  __dest = malloc(uVar32);
                  __ptr_00 = malloc(uVar32);
                  if (__ptr_00 != (void *)0x0 && __dest != (void *)0x0) {
                    if (uVar36 != 0) {
                      memcpy(__dest,tree_ll.lengths,uVar33 * 4);
                    }
                    if (uVar10 != 0) {
                      memcpy((void *)((long)__dest + uVar33 * 4),tree_d.lengths,uVar26 * 4);
                    }
                    bVar8 = true;
                    if (uVar19 == 0) {
LAB_001093fa:
                      local_210 = 0;
                    }
                    else {
                      uVar32 = 0;
                      lVar24 = 0;
                      do {
                        uVar1 = uVar32 + 1;
                        iVar70 = *(int *)((long)__dest + uVar32 * 4);
                        if (uVar1 < uVar19) {
                          uVar22 = 0;
                          uVar28 = uVar1;
                          do {
                            if (*(int *)((long)__dest + uVar28 * 4) != iVar70) break;
                            uVar22 = (ulong)((int)uVar22 + 1);
                            uVar28 = uVar1 + uVar22;
                          } while (uVar28 < uVar19);
                          uVar36 = (uint)uVar22;
                          if (uVar36 < 2 || iVar70 != 0) {
                            if (uVar36 < 3) goto LAB_00109320;
                            *(int *)((long)__ptr_00 + lVar24 * 4) = iVar70;
                            local_210 = lVar24 + 1;
                            if (5 < uVar36) {
                              lVar27 = (long)__ptr_00 + lVar24 * 4 + 8;
                              lVar30 = 0;
                              do {
                                *(undefined8 *)(lVar27 + -4) = 0x300000010;
                                lVar27 = lVar27 + 8;
                                lVar30 = lVar30 + -2;
                              } while ((ulong)(uint)((int)(uVar22 / 6) * 2) + lVar30 != 0);
                              local_210 = local_210 - lVar30;
                              lVar24 = lVar24 - lVar30;
                            }
                            uVar13 = uVar36 + (int)(uVar22 / 6) * -6;
                            if (uVar13 < 3) {
                              uVar36 = uVar36 - uVar13;
                            }
                            else {
                              *(undefined4 *)((long)__ptr_00 + local_210 * 4) = 0x10;
                              *(uint *)((long)__ptr_00 + lVar24 * 4 + 8) = uVar13 - 3;
                              local_210 = lVar24 + 3;
                            }
                          }
                          else {
                            uVar13 = uVar36 + 1;
                            if (uVar13 < 0xb) {
                              *(undefined4 *)((long)__ptr_00 + lVar24 * 4) = 0x11;
                              *(uint *)((long)__ptr_00 + lVar24 * 4 + 4) = uVar36 - 2;
                            }
                            else {
                              if (0x89 < uVar13) {
                                uVar13 = 0x8a;
                              }
                              *(undefined4 *)((long)__ptr_00 + lVar24 * 4) = 0x12;
                              *(uint *)((long)__ptr_00 + lVar24 * 4 + 4) = uVar13 - 0xb;
                              uVar36 = uVar13 - 1;
                            }
                            local_210 = lVar24 + 2;
                          }
                          uVar32 = uVar32 + uVar36;
                        }
                        else {
LAB_00109320:
                          *(int *)((long)__ptr_00 + lVar24 * 4) = iVar70;
                          local_210 = lVar24 + 1;
                        }
                        uVar32 = uVar32 + 1;
                        lVar24 = local_210;
                      } while (uVar32 != uVar19);
                      if (local_210 == 0) goto LAB_001093fa;
                      lVar24 = 0;
                      do {
                        uVar19 = (ulong)*(uint *)((long)__ptr_00 + lVar24 * 4);
                        *(int *)(*frequencies_00 + uVar19 * 4) =
                             *(int *)(*frequencies_00 + uVar19 * 4) + 1;
                        lVar24 = (lVar24 - (ulong)(uVar19 < 0x10)) + 2;
                      } while (lVar24 != local_210);
                      bVar8 = false;
                    }
                    uVar13 = HuffmanTree_makeFromFrequencies
                                       ((HuffmanTree *)local_98,(uint *)frequencies_00,0x13,0x13,7);
                    if (uVar13 == 0) {
                      uVar12 = local_98._8_8_;
                      uVar19 = 0x14;
                      lVar24 = 0x13;
                      do {
                        lVar27 = lVar24;
                        uVar32 = uVar19 - 1;
                        if (uVar32 < 5) {
                          uVar32 = 4;
                          break;
                        }
                        lVar30 = uVar19 * 4;
                        uVar19 = uVar32;
                        lVar24 = lVar27 + -1;
                      } while (*(uint *)(local_98._8_8_ +
                                        (ulong)*(uint *)(&UNK_001179c8 + lVar30) * 4) == 0);
                      writeBits(&local_190,(uint)bVar38,1);
                      writeBits(&local_190,0,1);
                      writeBits(&local_190,1,1);
                      writeBits(&local_190,(int)uVar33 - 0x101,5);
                      writeBits(&local_190,(int)uVar26 - 1,5);
                      writeBits(&local_190,(int)uVar32 - 4,4);
                      puVar25 = CLCL_ORDER;
                      do {
                        writeBits(&local_190,*(uint *)(uVar12 + (ulong)*puVar25 * 4),3);
                        puVar25 = puVar25 + 1;
                        lVar27 = lVar27 + -1;
                      } while (lVar27 != 0);
                      if (!bVar8) {
                        uVar11 = local_98._0_8_;
                        lVar24 = 0;
                        do {
                          uVar36 = *(uint *)((long)__ptr_00 + lVar24 * 4);
                          writeBitsReversed(&local_190,*(uint *)(uVar11 + (ulong)uVar36 * 4),
                                            (ulong)*(uint *)(uVar12 + (ulong)uVar36 * 4));
                          if (uVar36 - 0x10 < 3) {
                            lVar27 = lVar24 * 4;
                            lVar24 = lVar24 + 1;
                            writeBits(&local_190,*(uint *)((long)__ptr_00 + lVar27 + 4),
                                      *(size_t *)(&DAT_00117aa0 + (ulong)(uVar36 - 0x10) * 8));
                          }
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != local_210);
                      }
                      writeLZ77data(&local_190,(uivector *)local_108,&tree_ll,&tree_d);
                      if ((ulong)tree_ll.lengths[0x100] == 0) {
                        uVar13 = 0x40;
                      }
                      else {
                        writeBitsReversed(&local_190,tree_ll.codes[0x100],
                                          (ulong)tree_ll.lengths[0x100]);
                        uVar13 = 0;
                      }
                    }
                  }
                }
                else {
                  __ptr_00 = (void *)0x0;
                  __dest = (void *)0x0;
                  uVar13 = uVar14;
                }
              }
              else {
                __ptr_00 = (void *)0x0;
                __dest = (void *)0x0;
                uVar13 = uVar36;
              }
            }
LAB_001095fe:
            free((void *)local_108._0_8_);
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup((HuffmanTree *)local_98);
            free(puVar17);
            free(frequencies);
            free(frequencies_00);
            free(__dest);
            free(__ptr_00);
            uVar33 = local_70;
          }
          else {
            uVar13 = 0;
            if (settings->btype == 1) {
              tree_ll.codes = (uint *)0x0;
              tree_ll.lengths = (uint *)0x0;
              tree_ll.table_len = (uchar *)0x0;
              tree_ll.table_value = (unsigned_short *)0x0;
              tree_d.codes = (uint *)0x0;
              tree_d.lengths = (uint *)0x0;
              tree_d.table_len = (uchar *)0x0;
              tree_d.table_value = (unsigned_short *)0x0;
              uVar13 = generateFixedLitLenTree(&tree_ll);
              if ((uVar13 == 0) && (uVar13 = generateFixedDistanceTree(&tree_d), uVar13 == 0)) {
                writeBits(&local_190,(uint)bVar38,1);
                writeBits(&local_190,1,1);
                writeBits(&local_190,0,1);
                if (settings->use_lz77 == 0) {
                  puVar17 = tree_ll.codes;
                  puVar25 = tree_ll.lengths;
                  if (uVar32 < uVar19) {
                    lVar24 = 0;
                    do {
                      writeBitsReversed(&local_190,puVar17[puVar16[lVar24]],
                                        (ulong)puVar25[puVar16[lVar24]]);
                      lVar24 = lVar24 + 1;
                    } while (uVar26 + lVar37 != lVar24);
                  }
                }
                else {
                  local_98._0_16_ = (undefined1  [16])0x0;
                  local_98._16_8_ = 0;
                  uVar13 = encodeLZ77((uivector *)local_98,&hash,in,uVar32,uVar19,
                                      settings->windowsize,settings->minmatch,settings->nicematch,
                                      settings->lazymatching);
                  if (uVar13 != 0) {
                    free((void *)local_98._0_8_);
                    goto LAB_00108ccb;
                  }
                  writeLZ77data(&local_190,(uivector *)local_98,&tree_ll,&tree_d);
                  free((void *)local_98._0_8_);
                  puVar25 = tree_ll.lengths;
                  puVar17 = tree_ll.codes;
                }
                writeBitsReversed(&local_190,puVar17[0x100],(ulong)puVar25[0x100]);
                uVar13 = 0;
              }
LAB_00108ccb:
              HuffmanTree_cleanup(&tree_ll);
              HuffmanTree_cleanup(&tree_d);
            }
          }
          uVar33 = uVar33 + 1;
          if (uVar33 == uVar34) break;
          uVar23 = uVar23 + sVar29;
          lVar37 = lVar37 - sVar29;
          puVar16 = puVar16 + sVar29;
        } while (uVar13 == 0);
      }
    }
    free(local_d8);
    free(local_e0);
    free(__ptr);
    free(local_d0);
    free(__s_00);
    free(local_e8);
  }
LAB_0010970b:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}